

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolormap.cpp
# Opt level: O3

uint __thiscall QColormap::pixel(QColormap *this,QColor *color)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = QColor::rgba();
  uVar3 = 0;
  if (this->d->mode == Direct) {
    iVar1 = this->d->depth;
    if ((iVar1 == 0x20) || (iVar1 == 0x18)) {
      uVar3 = uVar2 | 0xff000000;
    }
    else if (iVar1 == 0x10) {
      uVar3 = uVar2 >> 8 & 0xf800 | uVar2 >> 5 & 0x7e0 | uVar2 >> 3 & 0x1f;
    }
  }
  return uVar3;
}

Assistant:

uint QColormap::pixel(const QColor &color) const
{
    QRgb rgb = color.rgba();
    if (d->mode == QColormap::Direct) {
        switch(d->depth) {
        case 16:
            return qt_convRgbTo16(rgb);
        case 24:
        case 32:
        {
            const int r = qRed(rgb);
            const int g = qGreen(rgb);
            const int b = qBlue(rgb);
            const int red_shift = 16;
            const int green_shift = 8;
            const int red_mask   = 0xff0000;
            const int green_mask = 0x00ff00;
            const int blue_mask  = 0x0000ff;
            const int tg = g << green_shift;
            const int tr = r << red_shift;
            return 0xff000000 | (b & blue_mask) | (tg & green_mask) | (tr & red_mask);
        }
        }
    }
    //XXX
    //return qt_screen->alloc(qRed(rgb), qGreen(rgb), qBlue(rgb));
    return 0;
}